

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QObject_*(*)()>::resize(QList<QObject_*(*)()> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QObject_*(*)()> *in_RSI;
  QArrayDataPointer<QObject_*(*)()> *in_RDI;
  QList<QObject_*(*)()> *unaff_retaddr;
  QArrayDataPointer<QObject_*(*)()> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QObject_*(*)()>::size((QList<QObject_*(*)()> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QObject_*(*)()>::operator->(in_RDI);
    QArrayDataPointer<QObject_*(*)()>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }